

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

Real __thiscall NavierStokesBase::estTimeStep(NavierStokesBase *this)

{
  uint uVar1;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> _Var2;
  pointer pSVar3;
  FArrayBox *pFVar4;
  undefined8 uVar5;
  char cVar6;
  undefined8 uVar7;
  pointer pbVar8;
  pointer pbVar9;
  NavierStokesBase *pNVar10;
  TimeCenter TVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  long lVar14;
  double *pdVar15;
  int *piVar16;
  int *piVar17;
  int iVar18;
  double *pdVar19;
  int idim;
  long lVar20;
  long lVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  int k;
  long lVar25;
  value_type_conflict2 *__val;
  double *pdVar26;
  long lVar27;
  bool bVar28;
  Real RVar29;
  double dVar30;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  double local_508;
  Box local_4c4;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_4a8;
  NavierStokesBase *local_4a0;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_498;
  long local_490;
  long local_488;
  long local_480;
  long local_478;
  long local_470;
  long local_468;
  long local_460;
  pointer local_458;
  pointer local_450;
  ulong local_448;
  long local_440;
  Arena *local_438;
  pointer local_430;
  ulong local_428;
  long local_420;
  Array4<double> local_418;
  MFIter mfi;
  undefined1 local_378 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  int local_350;
  Array4<double> local_1f0;
  MultiFab tforces;
  
  if (fixed_dt <= 0.0) {
    _Var2._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (((this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start)->new_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
    puVar12 = (undefined8 *)operator_new(0x18);
    *puVar12 = 0;
    puVar12[1] = 0;
    puVar12[2] = 0;
    puVar13 = (undefined8 *)operator_new(0x18);
    *puVar13 = 0;
    puVar13[1] = 0;
    puVar13[2] = 0;
    local_498._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_AmrLevel).state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[2].new_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
          0x100000000;
    mfi.fabArray._0_4_ = 2;
    __l._M_len = 3;
    __l._M_array = (iterator)&mfi;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&tforces,__l,(allocator_type *)&local_418);
    amrex::MultiFab::norm0
              ((Vector<double,_std::allocator<double>_> *)local_378,
               (MultiFab *)
               _Var2._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
               (Vector<int,_std::allocator<int>_> *)&tforces,0,true,true);
    pbVar8 = local_368.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = local_378._0_8_;
    local_378._0_8_ = (pointer)0x0;
    local_378._8_8_ = (Arena *)0x0;
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    operator_delete(puVar12,0x18);
    if ((pointer)local_378._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_378._0_8_,
                      (long)local_368.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - local_378._0_8_);
    }
    if (tforces.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase !=
        (_func_int **)0x0) {
      operator_delete(tforces.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase
                      ,tforces.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                       m_op._4_8_ -
                       (long)tforces.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                             _vptr_FabArrayBase);
    }
    local_378._0_8_ = (pointer)0x1;
    local_378._8_8_ = (Arena *)0x0;
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              (&tforces,&(this->super_AmrLevel).grids,&(this->super_AmrLevel).dmap,3,0,
               (MFInfo *)local_378,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_368);
    amrex::MFIter::MFIter
              (&mfi,(FabArrayBase *)
                    _Var2._M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
    pNVar10 = this;
    if (mfi.currentIndex < mfi.endIndex) {
      do {
        local_4a0 = pNVar10;
        local_4a8._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             _Var2._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        pNVar10 = local_4a0;
        _Var2._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             local_4a8._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        piVar17 = &mfi.currentIndex;
        amrex::MFIter::tilebox(&local_4c4,&mfi);
        pSVar3 = (pNVar10->super_AmrLevel).state.
                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start;
        TVar11 = amrex::StateDescriptor::timeType(pSVar3->desc);
        if (TVar11 == Point) {
          RVar29 = (pSVar3->new_time).stop;
        }
        else {
          RVar29 = ((pSVar3->new_time).start + (pSVar3->new_time).stop) * 0.5;
        }
        piVar16 = piVar17;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar16 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        pFVar4 = tforces.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[*piVar16];
        if (getForceVerbose != 0) {
          local_378._8_8_ = amrex::OutStream();
          local_378._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
          local_378._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
          *(undefined8 *)
           ((long)&local_368.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish +
           local_368.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
               *(undefined8 *)
                ((long)&((ArenaInfo *)(local_378._8_8_ + 8))->release_threshold +
                (long)(*(_func_int ***)local_378._8_8_)[-3]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_368,"---",3);
          local_418.p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_368,(char *)&local_418,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_368,"H - est Time Step:",0x12);
          local_418.p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_368,(char *)&local_418,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_368,"Calling getForce...",0x13);
          local_418.p = (double *)CONCAT71(local_418.p._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_368,(char *)&local_418,1);
          amrex::Print::~Print((Print *)local_378);
        }
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar17 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        uVar5 = *(undefined8 *)
                 (*(long *)((long)_Var2._M_t.
                                  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                  .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl +
                           0x108) + (long)*piVar17 * 8);
        (*(pNVar10->super_AmrLevel)._vptr_AmrLevel[0x2a])
                  (RVar29,pNVar10,pFVar4,&local_4c4,0,3,uVar5,uVar5,3,&mfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_378,
                   (FabArray<amrex::FArrayBox> *)
                   _Var2._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi,3);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_418,
                   (FabArray<amrex::FArrayBox> *)
                   local_498._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_1f0,&tforces.super_FabArray<amrex::FArrayBox>,&mfi);
        if (local_4c4.smallend.vect[2] <= local_4c4.bigend.vect[2]) {
          local_450 = (pointer)local_378._0_8_;
          local_438 = (Arena *)local_378._8_8_;
          local_458 = local_368.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          lVar27 = (long)local_4c4.smallend.vect[1];
          lVar21 = (long)local_4c4.smallend.vect[0];
          local_420 = local_1f0.jstride * 8;
          local_478 = (lVar27 - local_1f0.begin.y) * local_420 + lVar21 * 8 +
                      (long)local_1f0.begin.x * -8 + (long)local_1f0.p;
          local_470 = local_1f0.kstride * 8;
          local_488 = -(long)local_1f0.begin.z;
          local_480 = (lVar27 - local_418.begin.y) *
                      CONCAT44(local_418.jstride._4_4_,(undefined4)local_418.jstride) * 8 +
                      lVar21 * 8 + (long)local_418.begin.x * -8 + (long)local_418.p;
          local_460 = local_418.kstride * 8;
          local_468 = -(long)local_418.begin.z;
          local_490 = (long)local_350;
          local_440 = (long)local_368.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          local_428 = (ulong)(uint)local_4c4.bigend.vect[0];
          local_448 = (ulong)(uint)local_4c4.bigend.vect[1];
          iVar18 = local_4c4.smallend.vect[2];
          do {
            if (local_4c4.smallend.vect[1] <= local_4c4.bigend.vect[1]) {
              lVar14 = (long)iVar18;
              pdVar19 = (double *)((local_488 + lVar14) * local_470 + local_478);
              pdVar26 = (double *)((local_468 + lVar14) * local_460 + local_480);
              local_430 = (pointer)(local_378._0_8_ +
                                   (lVar14 - local_490) *
                                   (long)local_368.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start * 8);
              lVar14 = lVar27;
              do {
                if (local_4c4.smallend.vect[0] <= local_4c4.bigend.vect[0]) {
                  pdVar22 = pdVar19;
                  pdVar24 = pdVar26;
                  lVar25 = lVar21;
                  do {
                    dVar30 = local_430[(lVar14 - local_440) * local_378._8_8_ +
                                       (lVar25 - (int)local_368.
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                       )];
                    lVar20 = 3;
                    pdVar15 = pdVar22;
                    pdVar23 = pdVar24;
                    do {
                      *pdVar15 = (*pdVar15 - *pdVar23) * (1.0 / dVar30);
                      pdVar15 = pdVar15 + local_1f0.nstride;
                      pdVar23 = pdVar23 + local_418.nstride;
                      lVar20 = lVar20 + -1;
                    } while (lVar20 != 0);
                    lVar25 = lVar25 + 1;
                    pdVar22 = pdVar22 + 1;
                    pdVar24 = pdVar24 + 1;
                  } while (local_4c4.bigend.vect[0] + 1U != (int)lVar25);
                }
                lVar14 = lVar14 + 1;
                pdVar19 = pdVar19 + local_1f0.jstride;
                pdVar26 = pdVar26 + CONCAT44(local_418.jstride._4_4_,(undefined4)local_418.jstride);
              } while (local_4c4.bigend.vect[1] + 1U != (int)lVar14);
            }
            bVar28 = iVar18 != local_4c4.bigend.vect[2];
            iVar18 = iVar18 + 1;
          } while (bVar28);
        }
        amrex::MFIter::operator++(&mfi);
        this = local_4a0;
        _Var2._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
             (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)local_4a8;
        pNVar10 = local_4a0;
      } while (mfi.currentIndex < mfi.endIndex);
    }
    amrex::MFIter::~MFIter(&mfi);
    local_418.p = (double *)0x100000000;
    local_418.jstride._0_4_ = 2;
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)&local_418;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&mfi,__l_00,(allocator_type *)&local_1f0);
    amrex::MultiFab::norm0
              ((Vector<double,_std::allocator<double>_> *)local_378,&tforces,
               (Vector<int,_std::allocator<int>_> *)&mfi,0,true,true);
    pbVar9 = local_368.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = local_378._0_8_;
    local_378._0_8_ = (pointer)0x0;
    local_378._8_8_ = (Arena *)0x0;
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    operator_delete(puVar13,0x18);
    if ((pointer)local_378._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_378._0_8_,
                      (long)local_368.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - local_378._0_8_);
    }
    if ((__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0) {
      operator_delete((void *)mfi.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl,
                      mfi.tile_size.vect._0_8_ -
                      (long)mfi.m_fa._M_t.
                            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl);
    }
    local_508 = 1e+20;
    lVar21 = 0;
    do {
      dVar30 = local_508;
      if ((1e-08 < *(double *)(uVar7 + lVar21 * 8)) &&
         (dVar30 = (this->super_AmrLevel).geom.super_CoordSys.dx[lVar21] /
                   *(double *)(uVar7 + lVar21 * 8), local_508 <= dVar30)) {
        dVar30 = local_508;
      }
      local_508 = dVar30;
      dVar30 = local_508;
      if (1e-08 < *(double *)(uVar5 + lVar21 * 8)) {
        dVar30 = (this->super_AmrLevel).geom.super_CoordSys.dx[lVar21];
        dVar30 = (dVar30 + dVar30) / *(double *)(uVar5 + lVar21 * 8);
        if (dVar30 < 0.0) {
          dVar30 = sqrt(dVar30);
        }
        else {
          dVar30 = SQRT(dVar30);
        }
        if (local_508 <= dVar30) {
          dVar30 = local_508;
        }
      }
      local_508 = dVar30;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 3);
    if (1e+20 <= local_508) {
      if (init_dt <= 0.0) {
        local_378._8_8_ = amrex::OutStream();
        local_378._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
        local_378._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
        *(undefined8 *)
         ((long)&local_368.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         local_368.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
             *(undefined8 *)
              ((long)&((ArenaInfo *)(local_378._8_8_ + 8))->release_threshold +
              (long)(*(_func_int ***)local_378._8_8_)[-3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_368,
                   "\nNavierStokesBase::estTimeStep() failed to provide a good timestep ",0x43);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_368,
                   "(probably because initial velocity field is zero with no external forcing).\n",
                   0x4c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_368,
                   "Use ns.init_dt to provide a reasonable timestep on coarsest level.\n",0x43);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_368,"Note that ns.init_shrink will be applied to init_dt.",0x34
                  );
        cVar6 = (char)(ostringstream *)&local_368;
        std::ios::widen((char)local_368.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar6
                       );
        std::ostream::put(cVar6);
        std::ostream::flush();
        amrex::Print::~Print((Print *)local_378);
        amrex::Abort_host("\n");
      }
      else {
        uVar1 = (this->super_AmrLevel).level;
        dVar30 = 1.0;
        if ((ulong)uVar1 != 0) {
          dVar30 = 1.0;
          if (0 < (int)uVar1) {
            iVar18 = 1;
            lVar21 = 1;
            do {
              iVar18 = iVar18 * (((this->super_AmrLevel).parent)->n_cycle).
                                super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar21];
              lVar21 = lVar21 + 1;
            } while ((ulong)uVar1 + 1 != lVar21);
            dVar30 = (double)iVar18;
          }
          dVar30 = 1.0 / dVar30;
        }
        local_508 = init_dt * dVar30;
      }
    }
    else {
      local_508 = local_508 * cfl;
    }
    if (verbose != 0) {
      local_378._8_8_ = amrex::OutStream();
      local_378._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
      local_378._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
      *(undefined8 *)
       ((long)&local_368.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       local_368.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)
            ((long)&((ArenaInfo *)(local_378._8_8_ + 8))->release_threshold +
            (long)(*(_func_int ***)local_378._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_368,"estTimeStep :: \n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_368,"LEV = ",6);
      std::ostream::operator<<((ostringstream *)&local_368,(this->super_AmrLevel).level);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_368," UMAX = ",8);
      amrex::Print::~Print((Print *)local_378);
      lVar21 = 0;
      do {
        local_378._8_8_ = amrex::OutStream();
        local_378._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
        local_378._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
        *(undefined8 *)
         ((long)&local_368.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         local_368.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
             *(undefined8 *)
              ((long)&((ArenaInfo *)(local_378._8_8_ + 8))->release_threshold +
              (long)(*(_func_int ***)local_378._8_8_)[-3]);
        std::ostream::_M_insert<double>(*(double *)(uVar7 + lVar21 * 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_368,"  ",2);
        amrex::Print::~Print((Print *)local_378);
        lVar21 = lVar21 + 1;
      } while (lVar21 != 3);
      local_378._8_8_ = amrex::OutStream();
      local_378._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
      local_378._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
      *(undefined8 *)
       ((long)&local_368.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       local_368.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)
            ((long)&((ArenaInfo *)(local_378._8_8_ + 8))->release_threshold +
            (long)(*(_func_int ***)local_378._8_8_)[-3]);
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_368,(char *)&mfi,1);
      amrex::Print::~Print((Print *)local_378);
      if (getForceVerbose != 0) {
        local_378._8_8_ = amrex::OutStream();
        local_378._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
        local_378._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
        *(undefined8 *)
         ((long)&local_368.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         local_368.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
             *(undefined8 *)
              ((long)&((ArenaInfo *)(local_378._8_8_ + 8))->release_threshold +
              (long)(*(_func_int ***)local_378._8_8_)[-3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_368,"        FMAX = ",0xf);
        amrex::Print::~Print((Print *)local_378);
        lVar21 = 0;
        do {
          local_378._8_8_ = amrex::OutStream();
          local_378._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
          local_378._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
          *(undefined8 *)
           ((long)&local_368.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish +
           local_368.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
               *(undefined8 *)
                ((long)&((ArenaInfo *)(local_378._8_8_ + 8))->release_threshold +
                (long)(*(_func_int ***)local_378._8_8_)[-3]);
          std::ostream::_M_insert<double>(*(double *)(uVar5 + lVar21 * 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_368,"  ",2);
          amrex::Print::~Print((Print *)local_378);
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
        local_378._8_8_ = amrex::OutStream();
        local_378._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
        local_378._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
        *(undefined8 *)
         ((long)&local_368.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         local_368.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
             *(undefined8 *)
              ((long)&((ArenaInfo *)(local_378._8_8_ + 8))->release_threshold +
              (long)(*(_func_int ***)local_378._8_8_)[-3]);
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_368,(char *)&mfi,1);
        amrex::Print::~Print((Print *)local_378);
      }
      local_378._8_8_ = amrex::OutStream();
      local_378._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
      local_378._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
      *(undefined8 *)
       ((long)&local_368.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       local_368.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)
            ((long)&((ArenaInfo *)(local_378._8_8_ + 8))->release_threshold +
            (long)(*(_func_int ***)local_378._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_368,"estimated timestep: dt = ",0x19);
      std::ostream::_M_insert<double>(local_508);
      cVar6 = (char)(ostringstream *)&local_368;
      std::ios::widen((char)local_368.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      amrex::Print::~Print((Print *)local_378);
    }
    amrex::MultiFab::~MultiFab(&tforces);
    if ((pointer)uVar5 != (pointer)0x0) {
      operator_delete((void *)uVar5,(long)pbVar9 - uVar5);
    }
    if ((pointer)uVar7 != (pointer)0x0) {
      operator_delete((void *)uVar7,(long)pbVar8 - uVar7);
    }
  }
  else {
    uVar1 = (this->super_AmrLevel).level;
    dVar30 = 1.0;
    if ((ulong)uVar1 != 0) {
      dVar30 = 1.0;
      if (0 < (int)uVar1) {
        iVar18 = 1;
        lVar21 = 1;
        do {
          iVar18 = iVar18 * (((this->super_AmrLevel).parent)->n_cycle).
                            super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar21];
          lVar21 = lVar21 + 1;
        } while ((ulong)uVar1 + 1 != lVar21);
        dVar30 = (double)iVar18;
      }
      dVar30 = 1.0 / dVar30;
    }
    local_508 = fixed_dt * dVar30;
  }
  return local_508;
}

Assistant:

Real
NavierStokesBase::estTimeStep ()
{
    BL_PROFILE("NavierStokesBase::estTimeStep()");

    if (fixed_dt > 0.0)
    {
        Real factor = 1.0;

        if (!(level == 0))
        {
            int ratio = 1;
            for (int lev = 1; lev <= level; lev++)
            {
                ratio *= parent->nCycle(lev);
            }
            factor = 1.0/Real(ratio);
        }

        return factor*fixed_dt;
    }

    const Real  small         = 1.0e-8;
    Real        estdt         = 1.0e+20;

    MultiFab&   S_new         = get_new_data(State_Type);

    Vector<Real> u_max(AMREX_SPACEDIM);
    Vector<Real> f_max(AMREX_SPACEDIM);

    MultiFab& Gp = get_new_data(Gradp_Type);

    //
    // Find local max of velocity
    //
    u_max = S_new.norm0({AMREX_D_DECL(0,1,2)},0,true,true);

    //
    // Compute forcing terms: in this case this means external forces and grad(p)
    // Viscous terms not included since Crack-Nicholson is unconditionally stable
    // so no need to account for explicit part of viscous term
    //
    MultiFab tforces(grids,dmap,AMREX_SPACEDIM,0,MFInfo(),Factory());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(S_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const auto& bx          = mfi.tilebox();
       const auto  cur_time    = state[State_Type].curTime();
       auto& tforces_fab       = tforces[mfi];

       if (getForceVerbose) {
           amrex::Print() << "---" << '\n'
                          << "H - est Time Step:" << '\n'
                          << "Calling getForce..." << '\n';
       }
       getForce(tforces_fab,bx,0,AMREX_SPACEDIM,cur_time,S_new[mfi],S_new[mfi],Density,mfi);

       const auto& rho   = S_new.array(mfi,Density);
       const auto& gradp = Gp.array(mfi);
       const auto& force = tforces.array(mfi);
       amrex::ParallelFor(bx, [rho, gradp, force]
       AMREX_GPU_DEVICE(int i, int j, int k) noexcept
       {
          Real rho_inv = 1.0/rho(i,j,k);
          for (int n = 0; n < AMREX_SPACEDIM; n++) {
             force(i,j,k,n) -= gradp(i,j,k,n);
             force(i,j,k,n) *= rho_inv;
          }
       });
    }

    //
    // Find local max of tforces
    //
    f_max = tforces.norm0({AMREX_D_DECL(0,1,2)},0,true,true);

    //
    // Compute local estdt
    //
    const Real* dx = geom.CellSize();

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        if (u_max[idim] > small)
        {
            estdt = std::min(estdt, dx[idim]/u_max[idim]);
        }

        if (f_max[idim] > small)
        {
            estdt = std::min(estdt, std::sqrt(2.0*dx[idim]/f_max[idim]));
        }
    }

    //
    // Reduce estimated dt by CFL factor and find global min
    //
    ParallelDescriptor::ReduceRealMin(estdt);

    if ( estdt < 1.0e+20) {
      //
      // timestep estimation successful
      //
      estdt = estdt * cfl;
    }
    else if (init_dt > 0 ) {
      //
      // use init_dt, scale for amr level
      //
      Real factor = 1.0;

      if (!(level == 0))
      {
         int ratio = 1;
         for (int lev = 1; lev <= level; lev++)
         {
           ratio *= parent->nCycle(lev);
         }
         factor = 1.0/Real(ratio);
      }

      estdt = factor*init_dt;
    } else {
      Print()<<"\nNavierStokesBase::estTimeStep() failed to provide a good timestep "
             <<"(probably because initial velocity field is zero with no external forcing).\n"
             <<"Use ns.init_dt to provide a reasonable timestep on coarsest level.\n"
             <<"Note that ns.init_shrink will be applied to init_dt."<<std::endl;
      amrex::Abort("\n");
    }

    if (verbose)
    {
        const int IOProc = ParallelDescriptor::IOProcessorNumber();
        ParallelDescriptor::ReduceRealMax(u_max.dataPtr(), AMREX_SPACEDIM, IOProc);

        amrex::Print() << "estTimeStep :: \n" << "LEV = " << level << " UMAX = ";
        for (int k = 0; k < AMREX_SPACEDIM; k++)
        {
            amrex::Print() << u_max[k] << "  ";
        }
        amrex::Print() << '\n';

        if (getForceVerbose) {
           ParallelDescriptor::ReduceRealMax(f_max.dataPtr(), AMREX_SPACEDIM, IOProc);
           amrex::Print() << "        FMAX = ";
           for (int k = 0; k < AMREX_SPACEDIM; k++)
           {
              amrex::Print() << f_max[k] << "  ";
           }
           amrex::Print() << '\n';
        }
        Print()<<"estimated timestep: dt = "<<estdt<<std::endl;
    }

    return estdt;
}